

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O2

bool __thiscall
deqp::sl::ShaderCase::checkPixels
          (ShaderCase *this,Surface *surface,int minX,int maxX,int minY,int maxY)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int x;
  int iVar6;
  bool bVar7;
  bool bVar8;
  undefined1 local_1a8 [384];
  
  local_1a8._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar5 = surface->m_width * minY;
  bVar3 = 1;
  bVar4 = 0;
  bVar2 = true;
  do {
    iVar6 = minX;
    if (maxY < minY) {
      if (bVar2 == false) {
        if (bVar4 == 0) {
          if (bVar3 != 0) {
            return false;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
          std::operator<<((ostream *)(local_1a8 + 8),
                          "WARNING: got inconsistent results over the image, when all pixels should be the same color!"
                         );
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
          std::operator<<((ostream *)(local_1a8 + 8),
                          "WARNING: expecting all rendered pixels to be white or black, but got other colors as well!"
                         );
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
      }
      return bVar2;
    }
    for (; iVar6 <= maxX; iVar6 = iVar6 + 1) {
      uVar1 = *(uint *)((long)(surface->m_pixels).m_ptr + (long)(iVar5 + iVar6) * 4);
      if ((char)uVar1 == '\0') {
        if ((uVar1 & 0xff00) != 0) goto LAB_00d65e1a;
        bVar8 = (uVar1 & 0xff0000) == 0;
        bVar7 = false;
      }
      else {
        if (((uVar1 & 0xff) == 0xff) && ((~uVar1 & 0xff00) == 0)) {
          bVar7 = (~uVar1 & 0xff0000) == 0;
        }
        else {
LAB_00d65e1a:
          bVar7 = false;
        }
        bVar8 = false;
      }
      bVar2 = (bool)(bVar2 & bVar7);
      bVar3 = bVar3 & bVar8;
      bVar4 = bVar4 | ~(bVar7 | bVar8) & 1U;
    }
    minY = minY + 1;
    iVar5 = iVar5 + surface->m_width;
  } while( true );
}

Assistant:

bool ShaderCase::checkPixels(Surface& surface, int minX, int maxX, int minY, int maxY)
{
	TestLog& log		   = m_testCtx.getLog();
	bool	 allWhite	  = true;
	bool	 allBlack	  = true;
	bool	 anyUnexpected = false;

	DE_ASSERT((maxX > minX) && (maxY > minY));

	for (int y = minY; y <= maxY; y++)
	{
		for (int x = minX; x <= maxX; x++)
		{
			RGBA pixel = surface.getPixel(x, y);
			// Note: we really do not want to involve alpha in the check comparison
			// \todo [2010-09-22 kalle] Do we know that alpha would be one? If yes, could use color constants white and black.
			bool isWhite = (pixel.getRed() == 255) && (pixel.getGreen() == 255) && (pixel.getBlue() == 255);
			bool isBlack = (pixel.getRed() == 0) && (pixel.getGreen() == 0) && (pixel.getBlue() == 0);

			allWhite	  = allWhite && isWhite;
			allBlack	  = allBlack && isBlack;
			anyUnexpected = anyUnexpected || (!isWhite && !isBlack);
		}
	}

	if (!allWhite)
	{
		if (anyUnexpected)
			log << TestLog::Message
				<< "WARNING: expecting all rendered pixels to be white or black, but got other colors as well!"
				<< TestLog::EndMessage;
		else if (!allBlack)
			log << TestLog::Message
				<< "WARNING: got inconsistent results over the image, when all pixels should be the same color!"
				<< TestLog::EndMessage;

		return false;
	}
	return true;
}